

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aesgcmsiv.cc
# Opt level: O2

int anon_unknown.dwarf_2393d7::aead_aes_gcm_siv_open_gather
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *nonce,size_t nonce_len,uint8_t *in,
              size_t in_len,uint8_t *in_tag,size_t in_tag_len,uint8_t *ad,size_t ad_len)

{
  int iVar1;
  int line;
  uint8_t expected_tag [16];
  gcm_siv_record_keys keys;
  
  if (ad_len >> 0x3d == 0) {
    if (in_len < 0x1000000011 && in_tag_len == 0x10) {
      if (nonce_len == 0xc) {
        gcm_siv_keys((aead_aes_gcm_siv_ctx *)&ctx->state,&keys,nonce);
        gcm_siv_crypt(out,in,in_len,in_tag,keys.enc_block,&keys.enc_key.ks);
        gcm_siv_polyval(expected_tag,out,in_len,ad,ad_len,keys.auth_key,nonce);
        (*keys.enc_block)(expected_tag,expected_tag,&keys.enc_key.ks);
        iVar1 = CRYPTO_memcmp(expected_tag,in_tag,0x10);
        if (iVar1 == 0) {
          return 1;
        }
        iVar1 = 0x65;
        line = 0x35a;
      }
      else {
        iVar1 = 0x79;
        line = 0x349;
      }
    }
    else {
      iVar1 = 0x65;
      line = 0x344;
    }
  }
  else {
    iVar1 = 0x75;
    line = 0x33d;
  }
  ERR_put_error(0x1e,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aesgcmsiv.cc"
                ,line);
  return 0;
}

Assistant:

int aead_aes_gcm_siv_open_gather(const EVP_AEAD_CTX *ctx, uint8_t *out,
                                 const uint8_t *nonce, size_t nonce_len,
                                 const uint8_t *in, size_t in_len,
                                 const uint8_t *in_tag, size_t in_tag_len,
                                 const uint8_t *ad, size_t ad_len) {
  const uint64_t ad_len_64 = ad_len;
  if (ad_len_64 >= (UINT64_C(1) << 61)) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_TOO_LARGE);
    return 0;
  }

  const uint64_t in_len_64 = in_len;
  if (in_tag_len != EVP_AEAD_AES_GCM_SIV_TAG_LEN ||
      in_len_64 > (UINT64_C(1) << 36) + AES_BLOCK_SIZE) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_DECRYPT);
    return 0;
  }

  if (nonce_len != EVP_AEAD_AES_GCM_SIV_NONCE_LEN) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_UNSUPPORTED_NONCE_SIZE);
    return 0;
  }

  const struct aead_aes_gcm_siv_ctx *gcm_siv_ctx =
      (struct aead_aes_gcm_siv_ctx *)&ctx->state;

  struct gcm_siv_record_keys keys;
  gcm_siv_keys(gcm_siv_ctx, &keys, nonce);

  gcm_siv_crypt(out, in, in_len, in_tag, keys.enc_block, &keys.enc_key.ks);

  uint8_t expected_tag[EVP_AEAD_AES_GCM_SIV_TAG_LEN];
  gcm_siv_polyval(expected_tag, out, in_len, ad, ad_len, keys.auth_key, nonce);
  keys.enc_block(expected_tag, expected_tag, &keys.enc_key.ks);

  if (CRYPTO_memcmp(expected_tag, in_tag, sizeof(expected_tag)) != 0) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_DECRYPT);
    return 0;
  }

  return 1;
}